

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strfmt(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  __gnuc_va_list in_RCX;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  int result;
  int local_30;
  int local_4;
  
  if (((in_RDI == (char *)0x0) || (in_ESI == 0)) || (in_RDX == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    local_30 = vsnprintf(in_RDI,(long)in_ESI,in_RDX,in_RCX);
    if (in_ESI <= local_30) {
      local_30 = -1;
    }
    in_RDI[in_ESI + -1] = '\0';
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

NK_LIB int
nk_strfmt(char *buf, int buf_size, const char *fmt, va_list args)
{
int result = -1;
NK_ASSERT(buf);
NK_ASSERT(buf_size);
if (!buf || !buf_size || !fmt) return 0;
#ifdef NK_INCLUDE_STANDARD_IO
result = NK_VSNPRINTF(buf, (nk_size)buf_size, fmt, args);
result = (result >= buf_size) ? -1: result;
buf[buf_size-1] = 0;
#else
result = nk_vsnprintf(buf, buf_size, fmt, args);
#endif
return result;
}